

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

UnaryOp __thiscall
wasm::Random::pick<wasm::UnaryOp>(Random *this,FeatureOptions<wasm::UnaryOp> *picker)

{
  UnaryOp UVar1;
  value_type *pvVar2;
  vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> local_30;
  FeatureOptions<wasm::UnaryOp> *local_18;
  FeatureOptions<wasm::UnaryOp> *picker_local;
  Random *this_local;
  
  local_18 = picker;
  picker_local = (FeatureOptions<wasm::UnaryOp> *)this;
  items<wasm::UnaryOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>>(this,&local_30);
  UVar1 = *pvVar2;
  std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>::~vector(&local_30);
  return UVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }